

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_uncompress_chdr(backtrace_state *state,uchar *compressed,size_t compressed_size,
                       uint16_t *zdebug_table,backtrace_error_callback error_callback,void *data,
                       uchar **uncompressed,size_t *uncompressed_size)

{
  size_t size;
  int iVar1;
  uchar *pout;
  
  *uncompressed = (uchar *)0x0;
  *uncompressed_size = 0;
  if (compressed_size < 0x18) {
    return 1;
  }
  iVar1 = *(int *)compressed;
  size = *(size_t *)(compressed + 8);
  pout = (uchar *)tcmalloc_backtrace_alloc(state,size,error_callback,data);
  if (pout == (uchar *)0x0) {
    return 0;
  }
  if (iVar1 == 2) {
    iVar1 = elf_zstd_decompress(compressed + 0x18,compressed_size - 0x18,(uchar *)zdebug_table,pout,
                                size);
  }
  else {
    if (iVar1 != 1) goto LAB_0012902c;
    iVar1 = elf_zlib_inflate_and_verify
                      (compressed + 0x18,compressed_size - 0x18,zdebug_table,pout,size);
  }
  if (iVar1 != 0) {
    *uncompressed = pout;
    *uncompressed_size = size;
    return 1;
  }
LAB_0012902c:
  if (size != 0) {
    tcmalloc_backtrace_free(state,pout,size,error_callback,data);
  }
  return 1;
}

Assistant:

static int
elf_uncompress_chdr (struct backtrace_state *state,
		     const unsigned char *compressed, size_t compressed_size,
		     uint16_t *zdebug_table,
		     backtrace_error_callback error_callback, void *data,
		     unsigned char **uncompressed, size_t *uncompressed_size)
{
  b_elf_chdr chdr;
  char *alc;
  size_t alc_len;
  unsigned char *po;

  *uncompressed = NULL;
  *uncompressed_size = 0;

  /* The format starts with an ELF compression header.  */
  if (compressed_size < sizeof (b_elf_chdr))
    return 1;

  /* The lld linker can misalign a compressed section, so we can't safely read
     the fields directly as we can for other ELF sections.  See
     https://github.com/ianlancetaylor/libbacktrace/pull/120.  */
  memcpy (&chdr, compressed, sizeof (b_elf_chdr));

  alc = NULL;
  alc_len = 0;
  if (*uncompressed != NULL && *uncompressed_size >= chdr.ch_size)
    po = *uncompressed;
  else
    {
      alc_len = chdr.ch_size;
      alc = backtrace_alloc (state, alc_len, error_callback, data);
      if (alc == NULL)
	return 0;
      po = (unsigned char *) alc;
    }

  switch (chdr.ch_type)
    {
    case ELFCOMPRESS_ZLIB:
      if (!elf_zlib_inflate_and_verify (compressed + sizeof (b_elf_chdr),
					compressed_size - sizeof (b_elf_chdr),
					zdebug_table, po, chdr.ch_size))
	goto skip;
      break;

    case ELFCOMPRESS_ZSTD:
      if (!elf_zstd_decompress (compressed + sizeof (b_elf_chdr),
				compressed_size - sizeof (b_elf_chdr),
				(unsigned char *)zdebug_table, po,
				chdr.ch_size))
	goto skip;
      break;

    default:
      /* Unsupported compression algorithm.  */
      goto skip;
    }

  *uncompressed = po;
  *uncompressed_size = chdr.ch_size;

  return 1;

 skip:
  if (alc != NULL && alc_len > 0)
    backtrace_free (state, alc, alc_len, error_callback, data);
  return 1;
}